

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void CreatePropertyGeneratorExpressions
               (cmStringRange entries,cmBacktraceRange backtraces,
               vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               *items,bool evaluateForBuildsystem)

{
  bool bVar1;
  reference backtrace;
  cmCompiledGeneratorExpression *this;
  TargetPropertyEntry *this_00;
  auto_ptr<cmCompiledGeneratorExpression> local_a8;
  TargetPropertyEntry *local_a0 [3];
  undefined1 local_88 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  cmGeneratorExpression ge;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_48;
  const_iterator it;
  const_iterator btIt;
  bool evaluateForBuildsystem_local;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  *items_local;
  cmBacktraceRange backtraces_local;
  cmStringRange entries_local;
  
  backtraces_local.End._M_current = (cmListFileBacktrace *)entries.Begin._M_current;
  backtraces_local.Begin = backtraces.End._M_current;
  items_local = (vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                 *)backtraces.Begin._M_current;
  it._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
       ::begin((cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&items_local);
  local_48._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
       ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&backtraces_local.End);
  while( true ) {
    ge.Backtrace.Cur =
         (Entry *)cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ::end((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)&backtraces_local.End);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&ge.Backtrace.Cur);
    if (!bVar1) break;
    backtrace = __gnu_cxx::
                __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                ::operator*((__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                             *)&it);
    cmGeneratorExpression::cmGeneratorExpression((cmGeneratorExpression *)&cge,backtrace);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator*(&local_48);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_88,(string *)&cge);
    local_88._8_8_ = cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_88);
    cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_88 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_88._8_8_);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_88);
    this = cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                     ((auto_ptr<cmCompiledGeneratorExpression> *)(local_88 + 0x10));
    cmCompiledGeneratorExpression::SetEvaluateForBuildsystem(this,evaluateForBuildsystem);
    this_00 = (TargetPropertyEntry *)operator_new(0x10);
    cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              (&local_a8,(auto_ptr<cmCompiledGeneratorExpression> *)(local_88 + 0x10));
    cmGeneratorTarget::TargetPropertyEntry::TargetPropertyEntry
              (this_00,&local_a8,&cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem);
    local_a0[0] = this_00;
    std::
    vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ::push_back(items,local_a0);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_a8);
    cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_88 + 0x10));
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&cge);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_48);
    __gnu_cxx::
    __normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
    ::operator++((__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
                  *)&it);
  }
  return;
}

Assistant:

void CreatePropertyGeneratorExpressions(
  cmStringRange entries, cmBacktraceRange backtraces,
  std::vector<cmGeneratorTarget::TargetPropertyEntry*>& items,
  bool evaluateForBuildsystem = false)
{
  std::vector<cmListFileBacktrace>::const_iterator btIt = backtraces.begin();
  for (std::vector<std::string>::const_iterator it = entries.begin();
       it != entries.end(); ++it, ++btIt) {
    cmGeneratorExpression ge(*btIt);
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(*it);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    items.push_back(new cmGeneratorTarget::TargetPropertyEntry(cge));
  }
}